

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan.h
# Opt level: O0

Orphan<capnp::schema::Brand> * __thiscall
capnp::Orphanage::newOrphan<capnp::schema::Brand>
          (Orphan<capnp::schema::Brand> *__return_storage_ptr__,Orphanage *this)

{
  BuilderArena *arena;
  CapTableBuilder *capTable;
  StructSize size;
  OrphanBuilder local_38;
  Orphanage *local_18;
  Orphanage *this_local;
  
  arena = this->arena;
  capTable = this->capTable;
  local_18 = this;
  this_local = (Orphanage *)__return_storage_ptr__;
  size = _::structSize<capnp::schema::Brand,capnp::schema::Brand::_capnpPrivate>();
  _::OrphanBuilder::initStruct(&local_38,arena,capTable,size);
  Orphan<capnp::schema::Brand>::Orphan(__return_storage_ptr__,&local_38);
  _::OrphanBuilder::~OrphanBuilder(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Orphan<RootType> Orphanage::newOrphan() const {
  return Orphan<RootType>(_::OrphanBuilder::initStruct(arena, capTable, _::structSize<RootType>()));
}